

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O0

void dgemm(char transa,char transb,int m,int n,int k,double alpha,double *a,int lda,double *b,
          int ldb,double beta,double *c,int ldc)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  double local_50;
  double temp;
  bool notb;
  int iStack_40;
  bool nota;
  int nrowb;
  int nrowa;
  int l;
  int j;
  int i;
  double beta_local;
  double *a_local;
  double alpha_local;
  int k_local;
  int n_local;
  int m_local;
  char transb_local;
  char transa_local;
  
  bVar3 = transa != 'N';
  bVar4 = transa != 'n';
  iStack_40 = k;
  if (!bVar3 || !bVar4) {
    iStack_40 = m;
  }
  temp._4_4_ = n;
  if (transb == 'N' || transb == 'n') {
    temp._4_4_ = k;
  }
  if (((((transa != 'N') && (transa != 'n')) && (transa != 'C')) &&
      ((transa != 'c' && (transa != 'T')))) && (transa != 't')) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input TRANSA has an illegal value.\n");
    exit(1);
  }
  if (((transb != 'N') && (transb != 'n')) &&
     ((transb != 'C' && (((transb != 'c' && (transb != 'T')) && (transb != 't')))))) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input TRANSB has an illegal value.\n");
    exit(1);
  }
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input M has an illegal value.\n");
    exit(1);
  }
  if (n < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input N has an illegal value.\n");
    exit(1);
  }
  if (k < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input K has an illegal value.\n");
    exit(1);
  }
  iVar2 = i4_max(1,iStack_40);
  if (lda < iVar2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input LDA has an illegal value.\n");
    exit(1);
  }
  iVar2 = i4_max(1,temp._4_4_);
  if (ldb < iVar2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input LDB has an illegal value.\n");
    exit(1);
  }
  iVar2 = i4_max(1,m);
  if (ldc < iVar2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"DGEMM - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input LDC has an illegal value.\n");
    exit(1);
  }
  if (((m != 0) && (n != 0)) &&
     ((((alpha != 0.0 || (NAN(alpha))) && (k != 0)) || ((beta != 1.0 || (NAN(beta))))))) {
    if ((alpha != 0.0) || (NAN(alpha))) {
      if (transb != 'N' && transb != 'n') {
        if (bVar3 && bVar4) {
          for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
            for (l = 0; l < m; l = l + 1) {
              local_50 = 0.0;
              for (nrowb = 0; nrowb < k; nrowb = nrowb + 1) {
                local_50 = a[nrowb + l * lda] * b[nrowa + nrowb * ldb] + local_50;
              }
              if ((beta != 0.0) || (NAN(beta))) {
                c[l + nrowa * ldc] = alpha * local_50 + beta * c[l + nrowa * ldc];
              }
              else {
                c[l + nrowa * ldc] = alpha * local_50;
              }
            }
          }
        }
        else {
          for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
            if ((beta != 0.0) || (NAN(beta))) {
              if ((beta != 1.0) || (NAN(beta))) {
                for (l = 0; l < m; l = l + 1) {
                  c[l + nrowa * ldc] = beta * c[l + nrowa * ldc];
                }
              }
            }
            else {
              for (l = 0; l < m; l = l + 1) {
                c[l + nrowa * ldc] = 0.0;
              }
            }
            for (nrowb = 0; nrowb < k; nrowb = nrowb + 1) {
              if ((b[nrowa + nrowb * ldb] != 0.0) || (NAN(b[nrowa + nrowb * ldb]))) {
                dVar1 = b[nrowa + nrowb * ldb];
                for (l = 0; l < m; l = l + 1) {
                  c[l + nrowa * ldc] = alpha * dVar1 * a[l + nrowb * lda] + c[l + nrowa * ldc];
                }
              }
            }
          }
        }
      }
      else if (bVar3 && bVar4) {
        for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
          for (l = 0; l < m; l = l + 1) {
            local_50 = 0.0;
            for (nrowb = 0; nrowb < k; nrowb = nrowb + 1) {
              local_50 = a[nrowb + l * lda] * b[nrowb + nrowa * ldb] + local_50;
            }
            if ((beta != 0.0) || (NAN(beta))) {
              c[l + nrowa * ldc] = alpha * local_50 + beta * c[l + nrowa * ldc];
            }
            else {
              c[l + nrowa * ldc] = alpha * local_50;
            }
          }
        }
      }
      else {
        for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
          if ((beta != 0.0) || (NAN(beta))) {
            if ((beta != 1.0) || (NAN(beta))) {
              for (l = 0; l < m; l = l + 1) {
                c[l + nrowa * ldc] = beta * c[l + nrowa * ldc];
              }
            }
          }
          else {
            for (l = 0; l < m; l = l + 1) {
              c[l + nrowa * ldc] = 0.0;
            }
          }
          for (nrowb = 0; nrowb < k; nrowb = nrowb + 1) {
            if ((b[nrowb + nrowa * ldb] != 0.0) || (NAN(b[nrowb + nrowa * ldb]))) {
              dVar1 = b[nrowb + nrowa * ldb];
              for (l = 0; l < m; l = l + 1) {
                c[l + nrowa * ldc] = alpha * dVar1 * a[l + nrowb * lda] + c[l + nrowa * ldc];
              }
            }
          }
        }
      }
    }
    else if ((beta != 0.0) || (NAN(beta))) {
      for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
        for (l = 0; l < m; l = l + 1) {
          c[l + nrowa * ldc] = beta * c[l + nrowa * ldc];
        }
      }
    }
    else {
      for (nrowa = 0; nrowa < n; nrowa = nrowa + 1) {
        for (l = 0; l < m; l = l + 1) {
          c[l + nrowa * ldc] = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void dgemm ( char transa, char transb, int m, int n, int k, 
  double alpha, double a[], int lda, double b[], int ldb, double beta, 
  double c[], int ldc )

//****************************************************************************80
//
//  Purpose:
//
//    DGEMM computes C = alpha * A * B and related operations.
//
//  Discussion:
//
//    DGEMM performs one of the matrix-matrix operations
//
//     C := alpha * op ( A ) * op ( B ) + beta * C,
//
//    where op ( X ) is one of
//
//      op ( X ) = X   or   op ( X ) = X',
//
//    ALPHA and BETA are scalars, and A, B and C are matrices, with op ( A )
//    an M by K matrix, op ( B ) a K by N matrix and C an N by N matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 February 2014
//
//  Author:
//
//    Original FORTRAN77 version by Jack Dongarra.
//    C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n', op ( A ) = A.
//    'T' or 't', op ( A ) = A'.
//    'C' or 'c', op ( A ) = A'.
//
//    Input, char TRANSB, specifies the form of op ( B ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n', op ( B ) = B.
//    'T' or 't', op ( B ) = B'.
//    'C' or 'c', op ( B ) = B'.
//
//    Input, int M, the number of rows of the  matrix op ( A ) and of the  
//    matrix C.  0 <= M.
//
//    Input, int N, the number  of columns of the matrix op ( B ) and the 
//    number of columns of the matrix C.  0 <= N.
//
//    Input, int K, the number of columns of the matrix op ( A ) and the 
//    number of rows of the matrix op ( B ).  0 <= K.
//
//    Input, double ALPHA, the scalar multiplier 
//    for op ( A ) * op ( B ).
//
//    Input, double A(LDA,KA), where:
//    if TRANSA is 'N' or 'n', KA is equal to K, and the leading M by K
//    part of the array contains A;
//    if TRANSA is not 'N' or 'n', then KA is equal to M, and the leading
//    K by M part of the array must contain the matrix A.
//
//    Input, int LDA, the first dimension of A as declared in the calling 
//    routine.  When TRANSA = 'N' or 'n' then LDA must be at least max ( 1, M ), 
//    otherwise LDA must be at least max ( 1, K ).
//
//    Input, double B(LDB,KB), where:
//    if TRANSB is 'N' or 'n', kB is N, and the leading K by N 
//    part of the array contains B;
//    if TRANSB is not 'N' or 'n', then KB is equal to K, and the leading
//    N by K part of the array must contain the matrix B.
//
//    Input, int LDB, the first dimension of B as declared in the calling 
//    routine.  When TRANSB = 'N' or 'n' then LDB must be at least max ( 1, K ), 
//    otherwise LDB must be at least max ( 1, N ).
//
//    Input, double BETA, the scalar multiplier for C.
//
//    Input/output, double C[LDC*N].
//    On input, the leading M by N part of this array must contain the 
//    matrix C, except when BETA is 0.0, in which case C need not be set.
//    On output, the array C is overwritten by the M by N matrix
//    alpha * op ( A ) * op ( B ) + beta * C.
//
//    Input, int LDC, the first dimension of C as declared in the calling 
//    routine.  max ( 1, M ) <= LDC.
//
{
  int i;
//int info;
  int j;
  int l;
//int ncola;
  int nrowa;
  int nrowb;
  bool nota;
  bool notb;
  double temp;
//
//  Set NOTA and NOTB as true if A and B respectively are not
//  transposed and set NROWA, NCOLA and NROWB as the number of rows
//  and columns of A and the number of rows of B respectively.
//
  nota = ( ( transa == 'N' ) || ( transa == 'n' ) );

  if ( nota )
  {
    nrowa = m;
//  ncola = k;
  }
  else
  {
    nrowa = k;
//  ncola = m;
  }

  notb = ( ( transb == 'N' ) || ( transb == 'n' ) );

  if ( notb )
  {
    nrowb = k;
  }
  else
  {
    nrowb = n;
  }
//
//  Test the input parameters.
//
//info = 0;

  if ( ! ( transa == 'N' || transa == 'n' ||
           transa == 'C' || transa == 'c' ||
           transa == 'T' || transa == 't' ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input TRANSA has an illegal value.\n";
    exit ( 1 );
  }

  if ( ! ( transb == 'N' || transb == 'n' ||
           transb == 'C' || transb == 'c' ||
           transb == 'T' || transb == 't' ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input TRANSB has an illegal value.\n";
    exit ( 1 );
  }

  if ( m < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input M has an illegal value.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input N has an illegal value.\n";
    exit ( 1 );
  }

  if ( k  < 0 )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input K has an illegal value.\n";
    exit ( 1 );
  }

  if ( lda < i4_max ( 1, nrowa ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDA has an illegal value.\n";
    exit ( 1 );
  }

  if ( ldb < i4_max ( 1, nrowb ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDB has an illegal value.\n";
    exit ( 1 );
  }

  if ( ldc < i4_max ( 1, m ) )
  {
    cerr << "\n";
    cerr << "DGEMM - Fatal error!\n";
    cerr << "  Input LDC has an illegal value.\n";
    exit ( 1 );
  }
//
//  Quick return if possible.
//
  if ( m == 0 )
  {
    return;
  }

  if ( n == 0 )
  {
    return;
  }

  if ( ( alpha == 0.0 || k == 0 ) && ( beta == 1.0 ) )
  {
    return;
  }
//
//  And if alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    if ( beta == 0.0 )
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          c[i+j*ldc] = 0.0;
        }
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          c[i+j*ldc] = beta * c[i+j*ldc];
        }
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( notb )
  {
//
//  Form  C := alpha*A*B + beta*C.
//
    if ( nota )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( beta == 0.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = 0.0;
          }
        }
        else if ( beta != 1.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = beta * c[i+j*ldc];
          }
        }

        for ( l = 0; l < k; l++ )
        {
          if ( b[l+j*ldb] != 0.0 )
          {
            temp = alpha * b[l+j*ldb];
            for ( i = 0; i < m; i++ )
            {
              c[i+j*ldc] = c[i+j*ldc] + temp * a[i+l*lda];
            }
          }
        }

      }
    }
//
//  Form  C := alpha*A'*B + beta*C
//
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          temp = 0.0;
          for ( l = 0; l < k; l++ )
          {
            temp = temp + a[l+i*lda] * b[l+j*ldb];
          }

          if ( beta == 0.0 )
          {
            c[i+j*ldc] = alpha * temp;
          }
          else
          {
            c[i+j*ldc] = alpha * temp + beta * c[i+j*ldc];
          }
        }
      }
    }
  }
//
//  Form  C := alpha*A*B' + beta*C
//
  else
  {
    if ( nota )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( beta == 0.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = 0.0;
          }
        }
        else if ( beta != 1.0 )
        {
          for ( i = 0; i < m; i++ )
          {
            c[i+j*ldc] = beta * c[i+j*ldc];
          }
        }

        for ( l = 0; l < k; l++ )
        {
          if ( b[j+l*ldb] != 0.0 )
          {
            temp = alpha * b[j+l*ldb];
            for ( i = 0; i < m; i++ )
            {
              c[i+j*ldc] = c[i+j*ldc] + temp * a[i+l*lda];
            }
          }
        }
      }
    }
//
//  Form  C := alpha*A'*B' + beta*C
//
    else
    {
      for ( j = 0; j < n; j++ )
      {
        for ( i = 0; i < m; i++ )
        {
          temp = 0.0;
          for ( l = 0; l < k; l++ )
          {
            temp = temp + a[l+i*lda] * b[j+l*ldb];
          }
          if ( beta == 0.0 )
          {
            c[i+j*ldc] = alpha * temp;
          }
          else
          {
            c[i+j*ldc] = alpha * temp + beta * c[i+j*ldc];
          }
        }
      }
    }
  }

  return;
}